

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::StringOneofFieldGenerator::GenerateInlineAccessorDefinitions
          (StringOneofFieldGenerator *this,Printer *printer)

{
  Formatter format;
  Formatter local_48;
  
  local_48.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_48.vars_._M_t,
             &(this->super_StringFieldGenerator).super_FieldGenerator.variables_._M_t);
  Formatter::operator()<>
            (&local_48,
             "inline const std::string& $classname$::$name$() const {\n$annotate_get$  // @@protoc_insertion_point(field_get:$full_name$)\n  return _internal_$name$();\n}\ntemplate <typename ArgT0, typename... ArgT>\ninline void $classname$::set_$name$(ArgT0&& arg0, ArgT... args) {\n  if (!_internal_has_$name$()) {\n    clear_$oneof_name$();\n    set_has_$name$();\n    $field_member$.UnsafeSetDefault($init_value$);\n  }\n  $field_member$.$setter$($default_value_tag$, static_cast<ArgT0 &&>(arg0), args..., GetArenaForAllocation());\n$annotate_set$  // @@protoc_insertion_point(field_set:$full_name$)\n}\ninline std::string* $classname$::mutable_$name$() {\n  std::string* _s = _internal_mutable_$name$();\n$annotate_mutable$  // @@protoc_insertion_point(field_mutable:$full_name$)\n  return _s;\n}\ninline const std::string& $classname$::_internal_$name$() const {\n  if (_internal_has_$name$()) {\n    return $field_member$.Get();\n  }\n  return $default_string$;\n}\ninline void $classname$::_internal_set_$name$(const std::string& value) {\n  if (!_internal_has_$name$()) {\n    clear_$oneof_name$();\n    set_has_$name$();\n    $field_member$.UnsafeSetDefault($init_value$);\n  }\n  $field_member$.Set($default_value_tag$, value, GetArenaForAllocation());\n}\n"
            );
  Formatter::operator()<>
            (&local_48,
             "inline std::string* $classname$::_internal_mutable_$name$() {\n  if (!_internal_has_$name$()) {\n    clear_$oneof_name$();\n    set_has_$name$();\n    $field_member$.UnsafeSetDefault($init_value$);\n  }\n  return $field_member$.Mutable(\n      $default_variable_or_tag$, GetArenaForAllocation());\n}\ninline std::string* $classname$::$release_name$() {\n$annotate_release$  // @@protoc_insertion_point(field_release:$full_name$)\n  if (_internal_has_$name$()) {\n    clear_has_$oneof_name$();\n    return $field_member$.ReleaseNonDefault($init_value$, GetArenaForAllocation());\n  } else {\n    return nullptr;\n  }\n}\ninline void $classname$::set_allocated_$name$(std::string* $name$) {\n  if (has_$oneof_name$()) {\n    clear_$oneof_name$();\n  }\n  if ($name$ != nullptr) {\n    set_has_$name$();\n    $field_member$.UnsafeSetDefault($name$);\n    ::$proto_ns$::Arena* arena = GetArenaForAllocation();\n    if (arena != nullptr) {\n      arena->Own($name$);\n    }\n  }\n$annotate_set$  // @@protoc_insertion_point(field_set_allocated:$full_name$)\n}\n"
            );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_48.vars_._M_t);
  return;
}

Assistant:

void StringOneofFieldGenerator::GenerateInlineAccessorDefinitions(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  format(
      "inline const std::string& $classname$::$name$() const {\n"
      "$annotate_get$"
      "  // @@protoc_insertion_point(field_get:$full_name$)\n"
      "  return _internal_$name$();\n"
      "}\n"
      "template <typename ArgT0, typename... ArgT>\n"
      "inline void $classname$::set_$name$(ArgT0&& arg0, ArgT... args) {\n"
      "  if (!_internal_has_$name$()) {\n"
      "    clear_$oneof_name$();\n"
      "    set_has_$name$();\n"
      "    $field_member$.UnsafeSetDefault($init_value$);\n"
      "  }\n"
      "  $field_member$.$setter$($default_value_tag$,"
      " static_cast<ArgT0 &&>(arg0), args..., GetArenaForAllocation());\n"
      "$annotate_set$"
      "  // @@protoc_insertion_point(field_set:$full_name$)\n"
      "}\n"
      "inline std::string* $classname$::mutable_$name$() {\n"
      "  std::string* _s = _internal_mutable_$name$();\n"
      "$annotate_mutable$"
      "  // @@protoc_insertion_point(field_mutable:$full_name$)\n"
      "  return _s;\n"
      "}\n"
      "inline const std::string& $classname$::_internal_$name$() const {\n"
      "  if (_internal_has_$name$()) {\n"
      "    return $field_member$.Get();\n"
      "  }\n"
      "  return $default_string$;\n"
      "}\n"
      "inline void $classname$::_internal_set_$name$(const std::string& "
      "value) {\n"
      "  if (!_internal_has_$name$()) {\n"
      "    clear_$oneof_name$();\n"
      "    set_has_$name$();\n"
      "    $field_member$.UnsafeSetDefault($init_value$);\n"
      "  }\n"
      "  $field_member$.Set($default_value_tag$, value, "
      "GetArenaForAllocation());\n"
      "}\n");
  format(
      "inline std::string* $classname$::_internal_mutable_$name$() {\n"
      "  if (!_internal_has_$name$()) {\n"
      "    clear_$oneof_name$();\n"
      "    set_has_$name$();\n"
      "    $field_member$.UnsafeSetDefault($init_value$);\n"
      "  }\n"
      "  return $field_member$.Mutable(\n"
      "      $default_variable_or_tag$, GetArenaForAllocation());\n"
      "}\n"
      "inline std::string* $classname$::$release_name$() {\n"
      "$annotate_release$"
      "  // @@protoc_insertion_point(field_release:$full_name$)\n"
      "  if (_internal_has_$name$()) {\n"
      "    clear_has_$oneof_name$();\n"
      "    return $field_member$.ReleaseNonDefault($init_value$, "
      "GetArenaForAllocation());\n"
      "  } else {\n"
      "    return nullptr;\n"
      "  }\n"
      "}\n"
      "inline void $classname$::set_allocated_$name$(std::string* $name$) {\n"
      "  if (has_$oneof_name$()) {\n"
      "    clear_$oneof_name$();\n"
      "  }\n"
      "  if ($name$ != nullptr) {\n"
      "    set_has_$name$();\n"
      "    $field_member$.UnsafeSetDefault($name$);\n"
      "    ::$proto_ns$::Arena* arena = GetArenaForAllocation();\n"
      "    if (arena != nullptr) {\n"
      "      arena->Own($name$);\n"
      "    }\n"
      "  }\n"
      "$annotate_set$"
      "  // @@protoc_insertion_point(field_set_allocated:$full_name$)\n"
      "}\n");
}